

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Aig_Man_t * Llb_ReachableStates(Aig_Man_t *pAig)

{
  int iVar1;
  int i;
  abctime aVar2;
  Llb_Mnx_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  DdManager *unique;
  DdNode *n;
  abctime aVar3;
  Vec_Ptr_t *vNamesPi;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAVar5;
  Gia_ParLlb_t Pars;
  
  aVar2 = Abc_Clock();
  Llb_ManSetDefaultParams(&Pars);
  Pars.fSilent = 1;
  Pars.fCluster = 0;
  Pars.fReorder = 0;
  Pars.nBddMax = 100;
  Pars.nClusterMax = 500;
  Pars.fSkipOutCheck = Pars.fSilent;
  p = Llb_MnxStart(pAig,&Pars);
  iVar1 = Llb_Nonlin4Reachability(p);
  if (iVar1 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x468,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
  }
  iVar1 = Cudd_ReadSize(p->dd);
  p_00 = Vec_IntStartFull(iVar1);
  for (iVar1 = 0; iVar1 < pAig->nRegs; iVar1 = iVar1 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar1);
    i = Llb_ObjBddVar(p->vOrder,pObj);
    Vec_IntWriteEntry(p_00,i,iVar1);
  }
  unique = Cudd_Init(pAig->nRegs,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  n = Extra_TransferPermute(p->dd,unique,p->bReached,p_00->pArray);
  Cudd_Ref(n);
  Vec_IntFree(p_00);
  iVar1 = Cudd_ReadSize(unique);
  if (iVar1 == pAig->nRegs) {
    aVar3 = Abc_Clock();
    p->timeTotal = aVar3 - aVar2;
    Llb_MnxStop(p);
    vNamesPi = Abc_NodeGetFakeNames(pAig->nRegs);
    pAVar4 = Abc_NtkDeriveFromBdd(unique,n,"reached",vNamesPi);
    Abc_NodeFreeNames(vNamesPi);
    Cudd_RecursiveDeref(unique,n);
    Cudd_Quit(unique);
    pNtk = Abc_NtkBddToMuxes(pAVar4,0,1000000);
    Abc_NtkDelete(pAVar4);
    pAVar4 = Abc_NtkStrash(pNtk,0,1,0);
    Abc_NtkDelete(pNtk);
    pAVar5 = Abc_NtkToDar(pAVar4,0,0);
    Abc_NtkDelete(pAVar4);
    return pAVar5;
  }
  __assert_fail("Cudd_ReadSize(dd) == Saig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                ,0x479,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Llb_ReachableStates( Aig_Man_t * pAig )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Vec_Int_t * vPermute;
    Vec_Ptr_t * vNames;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    DdManager * dd;
    DdNode * bReached;
    Llb_Mnx_t * pMnn;
    Abc_Ntk_t * pNtk, * pNtkMuxes;
    Aig_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();

    // create parameters
    Llb_ManSetDefaultParams( pPars );
    pPars->fSkipOutCheck = 1;
    pPars->fCluster      = 0;
    pPars->fReorder      = 0;
    pPars->fSilent       = 1;
    pPars->nBddMax       = 100;
    pPars->nClusterMax   = 500;

    // run reachability
    pMnn = Llb_MnxStart( pAig, pPars );
    RetValue = Llb_Nonlin4Reachability( pMnn );
    assert( RetValue == 1 );

    // print BDD
//    Extra_bddPrint( pMnn->dd, pMnn->bReached ); 
//    Extra_bddPrintSupport( pMnn->dd, pMnn->bReached ); 
//    printf( "\n" );

    // collect flop output variables
    vPermute = Vec_IntStartFull( Cudd_ReadSize(pMnn->dd) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vPermute, Llb_ObjBddVar(pMnn->vOrder, pObj), i );

    // transfer the reached state BDD into the new manager
    dd = Cudd_Init( Saig_ManRegNum(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    bReached = Extra_TransferPermute( pMnn->dd, dd, pMnn->bReached, Vec_IntArray(vPermute) );  Cudd_Ref( bReached );
    Vec_IntFree( vPermute );
    assert( Cudd_ReadSize(dd) == Saig_ManRegNum(pAig) );

    // quit reachability engine
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnxStop( pMnn );

    // derive the network
    vNames = Abc_NodeGetFakeNames( Saig_ManRegNum(pAig) );
    pNtk = Abc_NtkDeriveFromBdd( dd, bReached, "reached", vNames );
    Abc_NodeFreeNames( vNames );
    Cudd_RecursiveDeref( dd, bReached );
    Cudd_Quit( dd );

    // convert
    pNtkMuxes = Abc_NtkBddToMuxes( pNtk, 0, 1000000 );
    Abc_NtkDelete( pNtk );
    pNtk = Abc_NtkStrash( pNtkMuxes, 0, 1, 0 );
    Abc_NtkDelete( pNtkMuxes );
    pAig = Abc_NtkToDar( pNtk, 0, 0 );
    Abc_NtkDelete( pNtk );
    return pAig;
}